

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_data.c
# Opt level: O1

LY_ERR lyd_print_tree(ly_out *out,lyd_node *root,LYD_FORMAT format,uint32_t options)

{
  LY_ERR LVar1;
  char *pcVar2;
  
  if (out == (ly_out *)0x0) {
    pcVar2 = "out";
  }
  else {
    if ((options & 1) == 0) {
      out->func_printed = 0;
      LVar1 = lyd_print_(out,root,format,options);
      return LVar1;
    }
    pcVar2 = "!(options & 0x01)";
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar2,"lyd_print_tree");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_print_tree(struct ly_out *out, const struct lyd_node *root, LYD_FORMAT format, uint32_t options)
{
    LY_CHECK_ARG_RET(NULL, out, !(options & LYD_PRINT_WITHSIBLINGS), LY_EINVAL);

    /* reset the number of printed bytes */
    out->func_printed = 0;

    /* print the subtree */
    LY_CHECK_RET(lyd_print_(out, root, format, options));

    return LY_SUCCESS;
}